

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateTypeName(ExpressionTranslateContext *ctx,TypeBase *type)

{
  TypeBase *pTVar1;
  char *format;
  
  if (type == (TypeBase *)0x0) goto LAB_002637d8;
  if (type->typeID == 1) {
    format = "void";
    goto LAB_002637f2;
  }
  if (type == (TypeBase *)0x0) goto LAB_002637d8;
  if (type->typeID == 2) {
    format = "bool";
    goto LAB_002637f2;
  }
  if (type == (TypeBase *)0x0) goto LAB_002637d8;
  if (type->typeID == 3) {
    format = "char";
    goto LAB_002637f2;
  }
  if (type == (TypeBase *)0x0) goto LAB_002637d8;
  if (type->typeID == 4) {
    format = "short";
    goto LAB_002637f2;
  }
  if (type == (TypeBase *)0x0) goto LAB_002637d8;
  if (type->typeID == 5) {
    format = "int";
    goto LAB_002637f2;
  }
  if (type == (TypeBase *)0x0) goto LAB_002637d8;
  if (type->typeID == 6) {
    format = "long long";
    goto LAB_002637f2;
  }
  if (type == (TypeBase *)0x0) goto LAB_002637d8;
  if (type->typeID == 7) {
    format = "float";
    goto LAB_002637f2;
  }
  if (type == (TypeBase *)0x0) goto LAB_002637d8;
  if (type->typeID == 8) {
    format = "double";
    goto LAB_002637f2;
  }
  if (type == (TypeBase *)0x0) goto LAB_002637d8;
  if (type->typeID == 9) {
    format = "unsigned";
    goto LAB_002637f2;
  }
  if (type == (TypeBase *)0x0) goto LAB_002637d8;
  if (type->typeID == 10) {
    format = "__function";
    goto LAB_002637f2;
  }
  if (type == (TypeBase *)0x0) goto LAB_002637d8;
  if (type->typeID == 0xb) {
    format = "_nullptr";
    goto LAB_002637f2;
  }
  if (type == (TypeBase *)0x0) {
LAB_002637d8:
    pTVar1 = (TypeBase *)0x0;
  }
  else {
    if (type->typeID == 0xc) {
      __assert_fail("!\"generic type TypeGeneric is not translated\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x9d,"void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)");
    }
    if (type == (TypeBase *)0x0) goto LAB_002637d8;
    if (type->typeID == 0xd) {
      __assert_fail("!\"generic type TypeGenericAlias is not translated\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0xa1,"void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)");
    }
    if (type == (TypeBase *)0x0) goto LAB_002637d8;
    if (type->typeID == 0xe) {
      __assert_fail("!\"virtual type TypeAuto is not translated\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0xa5,"void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)");
    }
    if (type == (TypeBase *)0x0) goto LAB_002637d8;
    if (type->typeID == 0x10) {
      format = "NULLCRef";
      goto LAB_002637f2;
    }
    if (type == (TypeBase *)0x0) goto LAB_002637d8;
    if (type->typeID == 0x11) {
      format = "NULLCAutoArray";
      goto LAB_002637f2;
    }
    if ((type == (TypeBase *)0x0) || (pTVar1 = type, type->typeID != 0x12)) goto LAB_002637d8;
  }
  if (pTVar1 != (TypeBase *)0x0) {
    TranslateTypeName(ctx,(TypeBase *)pTVar1[1]._vptr_TypeBase);
    format = "*";
    goto LAB_002637f2;
  }
  if ((type == (TypeBase *)0x0) || (pTVar1 = type, type->typeID != 0x13)) {
    pTVar1 = (TypeBase *)0x0;
  }
  if (pTVar1 != (TypeBase *)0x0) goto LAB_00263818;
  if ((type == (TypeBase *)0x0) || (pTVar1 = type, type->typeID != 0x14)) {
    pTVar1 = (TypeBase *)0x0;
  }
  if (pTVar1 != (TypeBase *)0x0) {
    Print(ctx,"NULLCArray< ");
    TranslateTypeName(ctx,*(TypeBase **)&pTVar1[1].typeIndex);
    format = " >";
LAB_002637f2:
    Print(ctx,format);
    return;
  }
  if ((type == (TypeBase *)0x0) || (pTVar1 = type, type->typeID != 0x15)) {
    pTVar1 = (TypeBase *)0x0;
  }
  if (pTVar1 != (TypeBase *)0x0) {
    Print(ctx,"NULLCFuncPtr<__typeProxy_");
    PrintEscapedName(ctx,pTVar1->name);
    format = ">";
    goto LAB_002637f2;
  }
  if (type == (TypeBase *)0x0) {
LAB_002638d9:
    pTVar1 = (TypeBase *)0x0;
  }
  else {
    if (type->typeID == 0x16) {
      __assert_fail("!\"generic type TypeGenericClassProto is not translated\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0xc6,"void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)");
    }
    if (type == (TypeBase *)0x0) goto LAB_002638d9;
    if (type->typeID == 0x17) {
      __assert_fail("!\"generic type TypeGenericClass is not translated\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0xca,"void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)");
    }
    if ((type == (TypeBase *)0x0) || (pTVar1 = type, type->typeID != 0x18)) goto LAB_002638d9;
  }
  if (pTVar1 != (TypeBase *)0x0) {
    PrintEscapedTypeName(ctx,pTVar1);
    return;
  }
  if ((type == (TypeBase *)0x0) || (pTVar1 = type, type->typeID != 0x19)) {
    pTVar1 = (TypeBase *)0x0;
  }
  if (pTVar1 == (TypeBase *)0x0) {
    if (type != (TypeBase *)0x0) {
      if (type->typeID == 0x1a) {
        __assert_fail("!\"virtual type TypeFunctionSet is not translated\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0xd6,"void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)");
      }
      if (type != (TypeBase *)0x0) {
        if (type->typeID == 0x1b) {
          __assert_fail("!\"virtual type TypeArgumentSet is not translated\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                        ,0xda,"void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)");
        }
        if ((type != (TypeBase *)0x0) && (type->typeID == 0x1c)) {
          __assert_fail("!\"virtual type TypeMemberSet is not translated\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                        ,0xde,"void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)");
        }
      }
    }
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                  ,0xe2,"void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)");
  }
LAB_00263818:
  PrintEscapedName(ctx,pTVar1->name);
  return;
}

Assistant:

void TranslateTypeName(ExpressionTranslateContext &ctx, TypeBase *type)
{
	if(isType<TypeVoid>(type))
	{
		Print(ctx, "void");
	}
	else if(isType<TypeBool>(type))
	{
		Print(ctx, "bool");
	}
	else if(isType<TypeChar>(type))
	{
		Print(ctx, "char");
	}
	else if(isType<TypeShort>(type))
	{
		Print(ctx, "short");
	}
	else if(isType<TypeInt>(type))
	{
		Print(ctx, "int");
	}
	else if(isType<TypeLong>(type))
	{
		Print(ctx, "long long");
	}
	else if(isType<TypeFloat>(type))
	{
		Print(ctx, "float");
	}
	else if(isType<TypeDouble>(type))
	{
		Print(ctx, "double");
	}
	else if(isType<TypeTypeID>(type))
	{
		Print(ctx, "unsigned");
	}
	else if(isType<TypeFunctionID>(type))
	{
		Print(ctx, "__function");
	}
	else if(isType<TypeNullptr>(type))
	{
		Print(ctx, "_nullptr");
	}
	else if(isType<TypeGeneric>(type))
	{
		assert(!"generic type TypeGeneric is not translated");
	}
	else if(isType<TypeGenericAlias>(type))
	{
		assert(!"generic type TypeGenericAlias is not translated");
	}
	else if(isType<TypeAuto>(type))
	{
		assert(!"virtual type TypeAuto is not translated");
	}
	else if(isType<TypeAutoRef>(type))
	{
		Print(ctx, "NULLCRef");
	}
	else if(isType<TypeAutoArray>(type))
	{
		Print(ctx, "NULLCAutoArray");
	}
	else if(TypeRef *typeRef = getType<TypeRef>(type))
	{
		TranslateTypeName(ctx, typeRef->subType);
		Print(ctx, "*");
	}
	else if(TypeArray *typeArray = getType<TypeArray>(type))
	{
		PrintEscapedName(ctx, typeArray->name);
	}
	else if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(type))
	{
		Print(ctx, "NULLCArray< ");
		TranslateTypeName(ctx, typeUnsizedArray->subType);
		Print(ctx, " >");
	}
	else if(TypeFunction *typeFunction = getType<TypeFunction>(type))
	{
		Print(ctx, "NULLCFuncPtr<__typeProxy_");
		PrintEscapedName(ctx, typeFunction->name);
		Print(ctx, ">");
	}
	else if(isType<TypeGenericClassProto>(type))
	{
		assert(!"generic type TypeGenericClassProto is not translated");
	}
	else if(isType<TypeGenericClass>(type))
	{
		assert(!"generic type TypeGenericClass is not translated");
	}
	else if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		PrintEscapedTypeName(ctx, typeClass);
	}
	else if(TypeEnum *typeEnum = getType<TypeEnum>(type))
	{
		PrintEscapedName(ctx, typeEnum->name);
	}
	else if(isType<TypeFunctionSet>(type))
	{
		assert(!"virtual type TypeFunctionSet is not translated");
	}
	else if(isType<TypeArgumentSet>(type))
	{
		assert(!"virtual type TypeArgumentSet is not translated");
	}
	else if(isType<TypeMemberSet>(type))
	{
		assert(!"virtual type TypeMemberSet is not translated");
	}
	else
	{
		assert(!"unknown type");
	}
}